

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  short *psVar4;
  long in_RDI;
  float fVar5;
  float border_y;
  ImU32 outer_col;
  ImRect outer_border;
  float draw_y2;
  bool is_frozen_separator;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImGuiTableInstanceData *table_instance;
  ImDrawList *inner_drawlist;
  ImGuiWindow *inner_window;
  ImGuiTable *in_stack_fffffffffffffec8;
  ImDrawList *in_stack_fffffffffffffed0;
  ImGuiTable *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  int idx;
  ImDrawList *in_stack_fffffffffffffee8;
  ImDrawListSplitter *in_stack_fffffffffffffef0;
  ImVec2 *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  undefined8 *in_stack_ffffffffffffff18;
  ImDrawList *in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff34;
  float local_bc;
  float local_b8;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  float fVar6;
  float in_stack_ffffffffffffff64;
  ImVec2 *in_stack_ffffffffffffff68;
  ImDrawList *in_stack_ffffffffffffff70;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  undefined1 local_44;
  undefined1 local_43;
  char local_42;
  undefined1 local_41;
  ImGuiTableColumn *local_40;
  int local_38;
  int local_34;
  float local_30;
  float local_2c;
  float local_28;
  undefined4 local_24;
  ImGuiTableInstanceData *local_20;
  ImDrawList *local_18;
  long local_10;
  long local_8;
  
  idx = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_10 = *(long *)(in_RDI + 0x188);
  local_8 = in_RDI;
  bVar3 = ImRect::Overlaps((ImRect *)(*(long *)(in_RDI + 0x180) + 0x250),(ImRect *)(in_RDI + 0xf0));
  if (bVar3) {
    local_18 = *(ImDrawList **)(local_10 + 0x2b0);
    ImDrawListSplitter::SetCurrentChannel(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,idx);
    ImDrawList::PushClipRect
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (ImVec2 *)in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0)
              );
    local_20 = TableGetInstanceData(in_stack_fffffffffffffec8,0);
    local_24 = 0x3f800000;
    if (*(short *)(local_8 + 0x228) < 1) {
      local_b8 = *(float *)(local_8 + 0x114);
    }
    else {
      local_b8 = *(float *)(local_8 + 0x104);
    }
    fVar5 = ImMax<float>(*(float *)(local_8 + 0x104),local_b8 + *(float *)(local_8 + 0xe8));
    local_bc = 1.0;
    if ((*(uint *)(local_8 + 4) & 0x100) == 0) {
      local_bc = 0.0;
    }
    fVar5 = fVar5 + local_bc;
    local_2c = *(float *)(local_8 + 0x10c);
    local_28 = fVar5;
    if ((*(byte *)(local_8 + 0x23a) & 1) != 0) {
      if (*(short *)(local_8 + 0x228) < 1) {
        in_stack_ffffffffffffff34 = *(float *)(local_8 + 0x114);
      }
      else {
        in_stack_ffffffffffffff34 = *(float *)(local_8 + 0x104);
      }
      fVar5 = ImMin<float>(*(float *)(local_8 + 0x10c),
                           in_stack_ffffffffffffff34 + local_20->LastTopHeadersRowHeight);
    }
    local_30 = fVar5;
    if ((*(uint *)(local_8 + 4) & 0x200) != 0) {
      for (local_34 = 0; local_34 < *(int *)(local_8 + 0x6c); local_34 = local_34 + 1) {
        if ((*(uint *)(*(long *)(local_8 + 0x48) + (long)(local_34 >> 5) * 4) &
            1 << ((byte)local_34 & 0x1f)) != 0) {
          psVar4 = ImSpan<short>::operator[]((ImSpan<short> *)(local_8 + 0x28),local_34);
          local_38 = (int)*psVar4;
          local_40 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(local_8 + 0x18),local_38);
          local_41 = *(short *)(local_8 + 0x20c) == local_38;
          uVar1 = in_stack_ffffffffffffff2c & 0xffffff;
          if (*(short *)(local_8 + 0x212) == local_38) {
            uVar1 = CONCAT13(*(short *)(local_8 + 0x7a) == *(short *)(local_8 + 0x78),
                             (int3)in_stack_ffffffffffffff2c);
          }
          in_stack_ffffffffffffff2c = uVar1;
          local_42 = (char)(in_stack_ffffffffffffff2c >> 0x18);
          local_43 = (local_40->Flags & 0x40000020U) == 0;
          local_44 = (int)*(short *)(local_8 + 0x22c) == local_34 + 1;
          if ((((local_40->MaxX < *(float *)(local_8 + 0x128) ||
                 local_40->MaxX == *(float *)(local_8 + 0x128)) || (local_42 != '\0')) &&
              (((local_40->NextEnabledColumn != -1 || ((bool)local_43)) ||
               (((*(uint *)(local_8 + 4) & 0xe000) == 0x4000 &&
                ((*(uint *)(local_8 + 4) & 0x10000) == 0)))))) &&
             ((local_40->ClipRect).Min.x < local_40->MaxX)) {
            in_stack_ffffffffffffff28 = local_2c;
            if ((((!(bool)local_41) && (local_42 == '\0')) && (!(bool)local_44)) &&
               ((*(uint *)(local_8 + 4) & 0x1800) != 0)) {
              in_stack_ffffffffffffff28 = local_30;
            }
            local_48 = in_stack_ffffffffffffff28;
            if (local_28 < in_stack_ffffffffffffff28) {
              in_stack_ffffffffffffff20 = local_18;
              ImVec2::ImVec2(&local_50,local_40->MaxX,local_28);
              ImVec2::ImVec2(&local_58,local_40->MaxX,local_48);
              TableGetColumnBorderCol
                        (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (int)in_stack_fffffffffffffed0);
              ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                  (ImVec2 *)in_stack_ffffffffffffff20,
                                  (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                                  SUB84(in_stack_ffffffffffffff18,0));
            }
          }
        }
      }
    }
    if ((*(uint *)(local_8 + 4) & 0x500) != 0) {
      local_68 = *(undefined8 *)(local_8 + 0xf0);
      local_60 = *(undefined8 *)(local_8 + 0xf8);
      local_6c = *(undefined4 *)(local_8 + 0xa4);
      if ((*(uint *)(local_8 + 4) & 0x500) == 0x500) {
        in_stack_ffffffffffffff18 = &local_68;
        ImVec2::ImVec2(&local_7c,1.0,1.0);
        local_74 = ::operator+((ImVec2 *)in_stack_fffffffffffffec8,(ImVec2 *)0x244cd8);
        ImDrawList::AddRect(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (ImU32)in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                            (ImDrawFlags)in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      }
      else if ((*(uint *)(local_8 + 4) & 0x400) == 0) {
        if ((*(uint *)(local_8 + 4) & 0x100) != 0) {
          local_68._4_4_ = (float)((ulong)local_68 >> 0x20);
          fVar6 = local_68._4_4_;
          in_stack_fffffffffffffed0 = local_18;
          fVar2 = (float)local_60;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff6c,fVar2,fVar6);
          ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (ImVec2 *)in_stack_ffffffffffffff20,
                              (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                              SUB84(in_stack_ffffffffffffff18,0));
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,(float)local_68,local_60._4_4_);
          ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                              (ImVec2 *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                              (ImVec2 *)in_stack_ffffffffffffff20,
                              (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                              SUB84(in_stack_ffffffffffffff18,0));
        }
      }
      else {
        local_60._4_4_ = (float)((ulong)local_60 >> 0x20);
        fVar6 = local_60._4_4_;
        fVar2 = (float)local_68;
        ImVec2::ImVec2(&local_84,fVar2,fVar6);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (ImVec2 *)in_stack_ffffffffffffff20,
                            (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                            SUB84(in_stack_ffffffffffffff18,0));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,(float)local_60,local_68._4_4_);
        ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (ImVec2 *)in_stack_ffffffffffffff20,
                            (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                            SUB84(in_stack_ffffffffffffff18,0));
      }
    }
    if ((((*(uint *)(local_8 + 4) & 0x80) != 0) &&
        (*(float *)(local_8 + 0x80) < *(float *)(local_8 + 0xfc))) &&
       ((fVar6 = *(float *)(local_8 + 0x80), *(float *)(local_8 + 0x134) <= fVar6 &&
        (fVar6 < *(float *)(local_8 + 0x13c))))) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff58,*(float *)(local_8 + 0xac),fVar6);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,*(float *)(local_8 + 0xb0),fVar6);
      ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff34,fVar5),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (ImVec2 *)in_stack_ffffffffffffff20,
                          (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                          SUB84(in_stack_ffffffffffffff18,0));
    }
    ImDrawList::PopClipRect(in_stack_fffffffffffffed0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = ImMax(table->InnerRect.Min.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight) + ((table->Flags & ImGuiTableFlags_BordersOuterH) ? 1.0f : 0.0f);
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table_instance->LastTopHeadersRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            float draw_y2 = (is_hovered || is_resized || is_frozen_separator || (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) == 0) ? draw_y2_body : draw_y2_head;
            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), TableGetColumnBorderCol(table, order_n, column_n), border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max + ImVec2(1, 1), outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border between it is above outer border.
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}